

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void cpool_remove_conn(cpool *cpool,connectdata *conn)

{
  undefined1 *puVar1;
  Curl_llist *pCVar2;
  Curl_llist *list;
  size_t sVar3;
  Curl_hash_element *pCVar4;
  Curl_hash_iterator iter;
  Curl_hash_iterator local_40;
  
  pCVar2 = Curl_node_llist(&conn->cpool_node);
  if ((pCVar2 != (Curl_llist *)0x0) &&
     (list = (Curl_llist *)
             Curl_hash_pick(&cpool->dest2bundle,conn->destination,conn->destination_len),
     pCVar2 == list)) {
    Curl_node_remove(&conn->cpool_node);
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 & 0xfd;
    sVar3 = Curl_llist_count(list);
    if (sVar3 == 0) {
      Curl_hash_start_iterate(&cpool->dest2bundle,&local_40);
      pCVar4 = Curl_hash_next_element(&local_40);
      if (pCVar4 != (Curl_hash_element *)0x0) {
        do {
          if ((Curl_llist *)pCVar4->ptr == list) {
            Curl_hash_delete(&cpool->dest2bundle,pCVar4->key,pCVar4->key_len);
            break;
          }
          pCVar4 = Curl_hash_next_element(&local_40);
        } while (pCVar4 != (Curl_hash_element *)0x0);
      }
    }
    conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffdffffffff);
    cpool->num_conn = cpool->num_conn - 1;
  }
  return;
}

Assistant:

static void cpool_remove_conn(struct cpool *cpool,
                              struct connectdata *conn)
{
  struct Curl_llist *list = Curl_node_llist(&conn->cpool_node);
  DEBUGASSERT(cpool);
  if(list) {
    /* The connection is certainly in the pool, but where? */
    struct cpool_bundle *bundle = cpool_find_bundle(cpool, conn);
    if(bundle && (list == &bundle->conns)) {
      cpool_bundle_remove(bundle, conn);
      if(!Curl_llist_count(&bundle->conns))
        cpool_remove_bundle(cpool, bundle);
      conn->bits.in_cpool = FALSE;
      cpool->num_conn--;
    }
    else {
      /* Not in  a bundle, already in the shutdown list? */
      DEBUGASSERT(list == &cpool->shutdowns);
    }
  }
}